

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

char * fmt::v11::detail::parse_arg_id<char,fmt::v11::detail::dynamic_spec_handler<char>>
                 (char *begin,char *end,dynamic_spec_handler<char> *handler)

{
  byte bVar1;
  arg_ref<char> *paVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *local_18;
  
  bVar1 = *begin;
  local_18 = (byte *)begin;
  if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_18 = (byte *)(begin + 1);
      iVar3 = 0;
    }
    else {
      iVar3 = parse_nonnegative_int<char>((char **)&local_18,end,0x7fffffff);
    }
    if ((local_18 == (byte *)end) || ((*local_18 != 0x3a && (*local_18 != 0x7d)))) {
LAB_00283dd3:
      report_error("invalid format string");
    }
    handler->ref->index = iVar3;
    *handler->kind = index;
    if (0 < handler->ctx->next_arg_id_) {
      report_error("cannot switch from automatic to manual argument indexing");
    }
    handler->ctx->next_arg_id_ = -1;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_00283dd3;
    pbVar5 = (byte *)(begin + 1);
    do {
      pbVar4 = pbVar5;
      local_18 = (byte *)end;
      if (pbVar4 == (byte *)end) break;
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (local_18 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    paVar2 = handler->ref;
    (paVar2->name).data_ = begin;
    (paVar2->name).size_ = (long)local_18 - (long)begin;
    *handler->kind = name;
    handler->ctx->next_arg_id_ = -1;
  }
  return (char *)local_18;
}

Assistant:

FMT_CONSTEXPR auto parse_arg_id(const Char* begin, const Char* end,
                                Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, INT_MAX);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      report_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (FMT_OPTIMIZE_SIZE > 1 || !is_name_start(c)) {
    report_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}